

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void config_add_comment(ALLEGRO_CONFIG *config,ALLEGRO_USTR *section,ALLEGRO_USTR *comment)

{
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_CONFIG_SECTION *pAVar2;
  ALLEGRO_CONFIG_ENTRY *pAVar3;
  ALLEGRO_USTR *us;
  
  pAVar2 = find_section(config,section);
  pAVar3 = (ALLEGRO_CONFIG_ENTRY *)
           al_calloc_with_context
                     (1,0x28,0xc5,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/config.c"
                      ,"config_add_comment");
  pAVar3->is_comment = true;
  us = al_ustr_dup(comment);
  pAVar3->key = us;
  al_ustr_find_replace_cstr(us,0,"\n"," ");
  if (pAVar2 == (ALLEGRO_CONFIG_SECTION *)0x0) {
    pAVar2 = config_add_section(config,section);
  }
  if (pAVar2->head == (ALLEGRO_CONFIG_ENTRY *)0x0) {
    pAVar2->head = pAVar3;
  }
  else {
    pAVar1 = pAVar2->last;
    pAVar1->next = pAVar3;
    pAVar3->prev = pAVar1;
  }
  pAVar2->last = pAVar3;
  return;
}

Assistant:

static void config_add_comment(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *section, const ALLEGRO_USTR *comment)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *entry;

   s = find_section(config, section);

   entry = al_calloc(1, sizeof(ALLEGRO_CONFIG_ENTRY));
   entry->is_comment = true;
   entry->key = al_ustr_dup(comment);

   /* Replace all newline characters by spaces, otherwise the written comment
    * file will be corrupted.
    */
   al_ustr_find_replace_cstr(entry->key, 0, "\n", " ");

   if (!s) {
      s = config_add_section(config, section);
   }

   if (s->head == NULL) {
      s->head = entry;
      s->last = entry;
   }
   else {
      ASSERT(s->last->next == NULL);
      s->last->next = entry;
      entry->prev = s->last;
      s->last = entry;
   }
}